

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile_tests.cpp
# Opt level: O0

void __thiscall skiwi::anon_unknown_23::and_optimized::and_optimized(and_optimized *this)

{
  and_optimized *this_local;
  
  compile_fixture::compile_fixture(&this->super_compile_fixture);
  (this->super_compile_fixture)._vptr_compile_fixture = (_func_int **)&PTR__and_optimized_0032ca98;
  return;
}

Assistant:

void test()
      {
      TEST_EQ("#t", run_optimized("(and #t)"));
      TEST_EQ("#f", run_optimized("(and #f)"));
      TEST_EQ("#t", run_optimized("(and #t #t)"));
      TEST_EQ("#f", run_optimized("(and #f #f)"));
      TEST_EQ("#f", run_optimized("(and #f #t)"));
      TEST_EQ("#f", run_optimized("(and #t #f)"));
      TEST_EQ("#t", run_optimized("(and #t #t #t)"));
      TEST_EQ("#f", run_optimized("(and #f #t #t)"));
      TEST_EQ("#f", run_optimized("(and #t #t #f)"));
      TEST_EQ("#f", run_optimized("(and #t #f #t)"));
      TEST_EQ("#f", run_optimized("(and #f #f #f)"));
      }